

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O1

datatype * __thiscall
mxx::datatype::contiguous(datatype *__return_storage_ptr__,datatype *this,size_t count)

{
  MPI_Datatype *ppoVar1;
  MPI_Datatype _blocks;
  MPI_Datatype _remainder;
  MPI_Aint extent;
  MPI_Datatype _block;
  int blocklen [2];
  MPI_Aint lb;
  MPI_Datatype mpitypes [2];
  MPI_Aint displs [2];
  MPI_Datatype local_88;
  undefined8 local_80;
  long local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  MPI_Datatype local_58;
  undefined8 local_50;
  undefined8 local_48;
  long local_40;
  
  __return_storage_ptr__->_vptr_datatype = (_func_int **)&PTR__datatype_00180c80;
  ppoVar1 = &__return_storage_ptr__->mpitype;
  __return_storage_ptr__->mpitype = (MPI_Datatype)&ompi_mpi_datatype_null;
  __return_storage_ptr__->builtin = false;
  if (count < 0x80000000) {
    MPI_Type_contiguous(count & 0xffffffff,this->mpitype,ppoVar1);
    MPI_Type_commit(ppoVar1);
  }
  else {
    MPI_Type_contiguous(0x7fffffff,this->mpitype,&local_70);
    MPI_Type_contiguous(count / 0x7fffffff & 0xffffffff,local_70,&local_88);
    if (count % 0x7fffffff == 0) {
      *ppoVar1 = local_88;
      MPI_Type_commit(ppoVar1);
    }
    else {
      MPI_Type_contiguous(count % 0x7fffffff,this->mpitype,&local_80);
      MPI_Type_get_extent(this->mpitype,local_60,&local_78);
      local_40 = (count / 0x7fffffff) * local_78 * 0x7fffffff;
      local_48 = 0;
      local_68 = 0x100000001;
      local_58 = local_88;
      local_50 = local_80;
      MPI_Type_create_struct(2);
      MPI_Type_commit(ppoVar1);
      MPI_Type_free(&local_80);
      MPI_Type_free(&local_88);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

datatype contiguous(size_t count) const {
        datatype result;
        if (count <= mxx::max_int) {
            result.builtin = false;
            MPI_Type_contiguous(count, this->mpitype, &result.mpitype);
            MPI_Type_commit(&result.mpitype);
        } else {
            result.builtin = false;
            // create custom data types of blocks and remainder
            std::size_t intmax = mxx::max_int;
            std::size_t nblocks = count / intmax;
            std::size_t rem = count % intmax;

            // create block and remainder data types
            MPI_Datatype _block;
            MPI_Type_contiguous(mxx::max_int, this->mpitype, &_block);
            MPI_Datatype _blocks;
            // create two contiguous types for blocks and remainder
            MPI_Type_contiguous(nblocks, _block, &_blocks);

            if (rem > 0) {
                MPI_Datatype _remainder;
                MPI_Type_contiguous(rem, this->mpitype, &_remainder);

                // create struct for the concatenation of this type
                MPI_Aint lb, extent;
                MPI_Type_get_extent(this->mpitype, &lb, &extent);
                MPI_Aint displ = nblocks*intmax*extent;
                MPI_Aint displs[2] = {0, displ};
                int blocklen[2] = {1, 1};
                MPI_Datatype mpitypes[2] = {_blocks, _remainder};
                MPI_Type_create_struct(2, blocklen, displs, mpitypes, &result.mpitype);
                MPI_Type_commit(&result.mpitype);
                MPI_Type_free(&_remainder);
                MPI_Type_free(&_blocks);
            } else {
                result.mpitype = _blocks;
                MPI_Type_commit(&result.mpitype);
            }
        }
        return result;
    }